

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

tests * lest::make_tests<lest::test[1]>(tests *__return_storage_ptr__,test (*c) [1])

{
  test *in_RCX;
  
  make<std::vector<lest::test,std::allocator<lest::test>>,lest::test>
            (__return_storage_ptr__,(lest *)c,c[1],in_RCX);
  return __return_storage_ptr__;
}

Assistant:

texts make_texts( C const & c ) { return make_texts( text_begin( c ), text_end( c ) ); }